

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
GOESRProduct::getImage(GOESRProduct *this,Handler *config)

{
  __shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  const_iterator cVar3;
  long in_RDX;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  local_38;
  
  (this->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p_Var1 = (__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> *)
           (config->type)._M_dataplus._M_p;
  if ((config->type)._M_string_length - (long)p_Var1 == 0x10) {
    std::__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8),p_Var1);
    Image::createFromFile((Image *)local_50,(shared_ptr<const_lrit::File> *)(local_50 + 8));
    uVar2 = local_50._0_8_;
    local_50._0_8_ = (__uniq_ptr_impl<Image,_std::default_delete<Image>_>)0x0;
    std::__uniq_ptr_impl<Image,_std::default_delete<Image>_>::reset
              ((__uniq_ptr_impl<Image,_std::default_delete<Image>_> *)this,(pointer)uVar2);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  else {
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    vector(&local_38,
           (vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
            *)config);
    Image::createFromFiles((Image *)local_50,&local_38);
    uVar2 = local_50._0_8_;
    local_50._0_8_ = (__uniq_ptr_impl<Image,_std::default_delete<Image>_>)0x0;
    std::__uniq_ptr_impl<Image,_std::default_delete<Image>_>::reset
              ((__uniq_ptr_impl<Image,_std::default_delete<Image>_> *)this,(pointer)uVar2);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_50);
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    ~vector(&local_38);
  }
  Image::fillSides((Image *)(this->files_).
                            super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
                  *)(in_RDX + 0xe0),&config->format);
  if (cVar3._M_node != (_Base_ptr)(in_RDX + 0xe8)) {
    Image::remap((Image *)(this->files_).
                          super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(Mat *)(cVar3._M_node + 2));
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Image> GOESRProduct::getImage(const Config::Handler& config) const {
  std::unique_ptr<Image> image;
  if (files_.size() == 1) {
    image = Image::createFromFile(files_[0]);
  } else {
    image = Image::createFromFiles(files_);
  }

  // This turns the white fills outside the disk black
  image->fillSides();

  // Remap image values if configured for this channel
  auto it = config.remap.find(channel_.nameShort);
  if (it != std::end(config.remap)) {
    image->remap(it->second);
  }

  return image;
}